

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

CSTOverlay * __thiscall
r_exec::CSTOverlay::get_offspring
          (CSTOverlay *this,HLPBindingMap *map,_Fact *input,_Fact *bound_pattern)

{
  CSTOverlay *this_00;
  uint64_t uVar1;
  P<r_exec::_Fact> local_48 [3];
  CSTOverlay *local_30;
  CSTOverlay *offspring;
  _Fact *bound_pattern_local;
  _Fact *input_local;
  HLPBindingMap *map_local;
  CSTOverlay *this_local;
  
  offspring = (CSTOverlay *)bound_pattern;
  bound_pattern_local = input;
  input_local = (_Fact *)map;
  map_local = (HLPBindingMap *)this;
  this_00 = (CSTOverlay *)operator_new(0x148);
  CSTOverlay(this_00,this);
  local_30 = this_00;
  core::P<r_exec::_Fact>::P(local_48,(_Fact *)offspring);
  r_code::list<core::P<r_exec::_Fact>_>::remove(&(this->super_HLPOverlay).patterns,(char *)local_48)
  ;
  core::P<r_exec::_Fact>::~P(local_48);
  if (this->match_deadline == 0) {
    uVar1 = BindingMap::get_fwd_before((BindingMap *)input_local);
    this->match_deadline = uVar1;
  }
  update(this,(HLPBindingMap *)input_local,bound_pattern_local,(_Fact *)offspring);
  return local_30;
}

Assistant:

CSTOverlay *CSTOverlay::get_offspring(HLPBindingMap *map, _Fact *input, _Fact *bound_pattern)
{
    CSTOverlay *offspring = new CSTOverlay(this);
    patterns.remove(bound_pattern);

    if (match_deadline == 0) {
        match_deadline = map->get_fwd_before();
    }

    update(map, input, bound_pattern);
    //std::cout<<std::hex<<this<<std::dec<<" produced: "<<std::hex<<offspring<<std::dec<<std::endl;
    return offspring;
}